

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall minibag::Player::advertise(Player *this,ConnectionInfo *c)

{
  PublisherMap *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  const_iterator __pos;
  iterator iVar1;
  iterator iVar2;
  Publisher pub;
  string callerid_topic;
  string callerid;
  AdvertiseOptions opts;
  undefined1 local_180 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
  local_130;
  AdvertiseOptions local_100;
  
  this_01 = &((c->header).
              super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"callerid",(allocator<char> *)(local_180 + 0x50));
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(this_01,&local_100.topic);
  std::__cxx11::string::~string((string *)&local_100);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(((c->header).
         super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_180 + 0x30),"",(allocator<char> *)&local_100);
  }
  else {
    std::__cxx11::string::string((string *)(local_180 + 0x30),(string *)(iVar1._M_node + 2));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_180 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_180 + 0x30),&c->topic);
  this_00 = &this->publishers_;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
          ::find(&this_00->_M_t,(key_type *)(local_180 + 0x10));
  if ((_Rb_tree_header *)iVar2._M_node == &(this->publishers_)._M_t._M_impl.super__Rb_tree_header) {
    createAdvertiseOptions(&local_100,c,(this->options_).queue_size,(string *)this);
    miniros::NodeHandle::advertise((AdvertiseOptions *)local_180);
    __pos._M_node = (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_miniros::Publisher_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
                *)(local_180 + 0x50),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_180 + 0x10),(Publisher *)local_180);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,miniros::Publisher>,std::_Select1st<std::pair<std::__cxx11::string_const,miniros::Publisher>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,miniros::Publisher>>>
    ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,miniros::Publisher>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,miniros::Publisher>,std::_Select1st<std::pair<std::__cxx11::string_const,miniros::Publisher>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,miniros::Publisher>>>
                *)this_00,__pos,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
                *)(local_180 + 0x50));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
             *)(local_180 + 0x50));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
    ::find(&this_00->_M_t,(key_type *)(local_180 + 0x10));
    miniros::Publisher::~Publisher((Publisher *)local_180);
    miniros::AdvertiseOptions::~AdvertiseOptions(&local_100);
  }
  std::__cxx11::string::~string((string *)(local_180 + 0x10));
  std::__cxx11::string::~string((string *)(local_180 + 0x30));
  return;
}

Assistant:

void Player::advertise(const ConnectionInfo* c)
{
    miniros::M_string::const_iterator header_iter = c->header->find("callerid");
    std::string callerid = (header_iter != c->header->end() ? header_iter->second : string(""));

    string callerid_topic = callerid + c->topic;

    map<string, miniros::Publisher>::iterator pub_iter = publishers_.find(callerid_topic);
    if (pub_iter == publishers_.end()) {
        miniros::AdvertiseOptions opts = createAdvertiseOptions(c, options_.queue_size, options_.prefix);

        miniros::Publisher pub = node_handle_.advertise(opts);
        publishers_.insert(publishers_.begin(), pair<string, miniros::Publisher>(callerid_topic, pub));

        pub_iter = publishers_.find(callerid_topic);
    }
}